

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

int __thiscall QtMWidgets::StepperPrivate::init(StepperPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QColor *pQVar3;
  QTimer *this_00;
  QStyleOption local_50 [8];
  QStyleOption opt;
  QPalette local_28 [24];
  StepperPrivate *local_10;
  StepperPrivate *this_local;
  
  local_10 = this;
  QStyleOption::QStyleOption(local_50,1,0);
  QStyleOption::initFrom((QWidget *)local_50);
  pQVar3 = QPalette::color(local_28,Highlight);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->color).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->color = uVar1;
  this_00 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_00,(QObject *)this->q);
  this->timer = this_00;
  iVar2 = QStyleOption::~QStyleOption(local_50);
  return iVar2;
}

Assistant:

void
StepperPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	color = opt.palette.color( QPalette::Highlight );

	timer = new QTimer( q );
}